

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QVariant * __thiscall
QWidget::inputMethodQuery(QVariant *__return_storage_ptr__,QWidget *this,InputMethodQuery query)

{
  QWidgetData *pQVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  QRect QVar5;
  
  if ((int)query < 0x80) {
    if (query != ImCursorRectangle) {
      if (query == ImFont) {
        QFont::operator_cast_to_QVariant(__return_storage_ptr__,&this->data->fnt);
        return __return_storage_ptr__;
      }
      goto LAB_0030b96a;
    }
    pQVar1 = this->data;
    iVar3 = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
    uVar4 = (iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1;
    QVar5.y1.m_i = 0;
    QVar5.x1.m_i = uVar4;
    QVar5.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
    QVar5.x2.m_i = uVar4;
  }
  else {
    if (query == ImAnchorPosition) {
      (**(code **)(*(long *)this + 400))(__return_storage_ptr__,this,8);
      return __return_storage_ptr__;
    }
    if (query == ImHints) {
      for (lVar2 = *(long *)&this->field_0x8; (*(byte *)(lVar2 + 0x253) & 4) != 0;
          lVar2 = *(long *)(*(long *)(*(long *)(*(long *)(lVar2 + 8) + 8) + 0x10) + 8)) {
      }
      ::QVariant::QVariant(__return_storage_ptr__,*(int *)(lVar2 + 0xd0));
      return __return_storage_ptr__;
    }
    if (query != ImInputItemClipRectangle) {
LAB_0030b96a:
      (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
      *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
      return __return_storage_ptr__;
    }
    QVar5 = QWidgetPrivate::clipRect(*(QWidgetPrivate **)&this->field_0x8);
  }
  ::QVariant::QVariant(__return_storage_ptr__,QVar5);
  return __return_storage_ptr__;
}

Assistant:

QVariant QWidget::inputMethodQuery(Qt::InputMethodQuery query) const
{
    switch(query) {
    case Qt::ImCursorRectangle:
        return QRect(width()/2, 0, 1, height());
    case Qt::ImFont:
        return font();
    case Qt::ImAnchorPosition:
        // Fallback.
        return inputMethodQuery(Qt::ImCursorPosition);
    case Qt::ImHints:
        return (int)inputMethodHints();
    case Qt::ImInputItemClipRectangle:
        return d_func()->clipRect();
    default:
        return QVariant();
    }
}